

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void replaceFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  uchar uVar1;
  sqlite3 *psVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uchar *puVar9;
  uchar *__s2;
  uchar *__src;
  char *z;
  char *pcVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  long local_68;
  
  psVar2 = context->pOut->db;
  puVar9 = sqlite3_value_text(*argv);
  if (puVar9 != (uchar *)0x0) {
    uVar4 = sqlite3_value_bytes(*argv);
    __s2 = sqlite3_value_text(argv[1]);
    if (__s2 != (uchar *)0x0) {
      if (*__s2 == '\0') {
        sqlite3_result_value(context,*argv);
        return;
      }
      iVar5 = sqlite3_value_bytes(argv[1]);
      __src = sqlite3_value_text(argv[2]);
      if (__src != (uchar *)0x0) {
        iVar6 = sqlite3_value_bytes(argv[2]);
        local_68 = (long)(int)(uVar4 + 1);
        z = (char *)contextMalloc(context,local_68);
        if (z != (char *)0x0) {
          iVar13 = 0;
          iVar8 = 0;
          uVar12 = 0;
          do {
            if ((int)(uVar4 - iVar5) < iVar13) {
              memcpy(z + iVar8,puVar9 + iVar13,(long)(int)(uVar4 - iVar13));
              iVar8 = (uVar4 - iVar13) + iVar8;
              z[iVar8] = '\0';
              sqlite3_result_text(context,z,iVar8,sqlite3_free);
              return;
            }
            uVar1 = puVar9[iVar13];
            if ((uVar1 == *__s2) && (iVar7 = bcmp(puVar9 + iVar13,__s2,(long)iVar5), iVar7 == 0)) {
              pcVar10 = z;
              if (iVar5 < iVar6) {
                if ((long)psVar2->aLimit[0] < local_68 + (iVar6 - iVar5) + -1) {
                  sqlite3_result_error_toobig(context);
LAB_001841b5:
                  sqlite3_free(z);
                  return;
                }
                local_68 = local_68 + (iVar6 - iVar5);
                uVar11 = uVar12 + 1;
                uVar3 = uVar11 & uVar12;
                uVar12 = uVar11;
                if ((uVar3 == 0) &&
                   (pcVar10 = (char *)sqlite3_realloc64(z,(long)(int)local_68 +
                                                          (int)~uVar4 + local_68),
                   pcVar10 == (char *)0x0)) {
                  sqlite3_result_error_nomem(context);
                  goto LAB_001841b5;
                }
              }
              z = pcVar10;
              memcpy(z + iVar8,__src,(long)iVar6);
              iVar8 = iVar8 + iVar6;
              iVar13 = iVar13 + iVar5 + -1;
            }
            else {
              z[iVar8] = uVar1;
              iVar8 = iVar8 + 1;
            }
            iVar13 = iVar13 + 1;
          } while( true );
        }
      }
    }
  }
  return;
}

Assistant:

static void replaceFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const unsigned char *zStr;        /* The input string A */
  const unsigned char *zPattern;    /* The pattern string B */
  const unsigned char *zRep;        /* The replacement string C */
  unsigned char *zOut;              /* The output */
  int nStr;                /* Size of zStr */
  int nPattern;            /* Size of zPattern */
  int nRep;                /* Size of zRep */
  i64 nOut;                /* Maximum size of zOut */
  int loopLimit;           /* Last zStr[] that might match zPattern[] */
  int i, j;                /* Loop counters */
  unsigned cntExpand;      /* Number zOut expansions */
  sqlite3 *db = sqlite3_context_db_handle(context);

  assert( argc==3 );
  UNUSED_PARAMETER(argc);
  zStr = sqlite3_value_text(argv[0]);
  if( zStr==0 ) return;
  nStr = sqlite3_value_bytes(argv[0]);
  assert( zStr==sqlite3_value_text(argv[0]) );  /* No encoding change */
  zPattern = sqlite3_value_text(argv[1]);
  if( zPattern==0 ){
    assert( sqlite3_value_type(argv[1])==SQLITE_NULL
            || sqlite3_context_db_handle(context)->mallocFailed );
    return;
  }
  if( zPattern[0]==0 ){
    assert( sqlite3_value_type(argv[1])!=SQLITE_NULL );
    sqlite3_result_value(context, argv[0]);
    return;
  }
  nPattern = sqlite3_value_bytes(argv[1]);
  assert( zPattern==sqlite3_value_text(argv[1]) );  /* No encoding change */
  zRep = sqlite3_value_text(argv[2]);
  if( zRep==0 ) return;
  nRep = sqlite3_value_bytes(argv[2]);
  assert( zRep==sqlite3_value_text(argv[2]) );
  nOut = nStr + 1;
  assert( nOut<SQLITE_MAX_LENGTH );
  zOut = contextMalloc(context, (i64)nOut);
  if( zOut==0 ){
    return;
  }
  loopLimit = nStr - nPattern;  
  cntExpand = 0;
  for(i=j=0; i<=loopLimit; i++){
    if( zStr[i]!=zPattern[0] || memcmp(&zStr[i], zPattern, nPattern) ){
      zOut[j++] = zStr[i];
    }else{
      if( nRep>nPattern ){
        nOut += nRep - nPattern;
        testcase( nOut-1==db->aLimit[SQLITE_LIMIT_LENGTH] );
        testcase( nOut-2==db->aLimit[SQLITE_LIMIT_LENGTH] );
        if( nOut-1>db->aLimit[SQLITE_LIMIT_LENGTH] ){
          sqlite3_result_error_toobig(context);
          sqlite3_free(zOut);
          return;
        }
        cntExpand++;
        if( (cntExpand&(cntExpand-1))==0 ){
          /* Grow the size of the output buffer only on substitutions
          ** whose index is a power of two: 1, 2, 4, 8, 16, 32, ... */
          u8 *zOld;
          zOld = zOut;
          zOut = sqlite3_realloc64(zOut, (int)nOut + (nOut - nStr - 1));
          if( zOut==0 ){
            sqlite3_result_error_nomem(context);
            sqlite3_free(zOld);
            return;
          }
        }
      }
      memcpy(&zOut[j], zRep, nRep);
      j += nRep;
      i += nPattern-1;
    }
  }
  assert( j+nStr-i+1<=nOut );
  memcpy(&zOut[j], &zStr[i], nStr-i);
  j += nStr - i;
  assert( j<=nOut );
  zOut[j] = 0;
  sqlite3_result_text(context, (char*)zOut, j, sqlite3_free);
}